

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O2

void Abc_NodeMffcConeSuppPrint(Abc_Obj_t *pNode)

{
  Vec_Ptr_t *vCone;
  Vec_Ptr_t *vSupp;
  char *pcVar1;
  Abc_Obj_t *pObj;
  int i;
  
  vCone = Vec_PtrAlloc(100);
  vSupp = Vec_PtrAlloc(100);
  Abc_NodeDeref_rec(pNode);
  Abc_NodeMffcConeSupp(pNode,vCone,vSupp);
  Abc_NodeRef_rec(pNode);
  pcVar1 = Abc_ObjName(pNode);
  printf("Node = %6s : Supp = %3d  Cone = %3d  (",pcVar1,(ulong)(uint)vSupp->nSize,
         (ulong)(uint)vCone->nSize);
  for (i = 0; i < vCone->nSize; i = i + 1) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vCone,i);
    pcVar1 = Abc_ObjName(pObj);
    printf(" %s",pcVar1);
  }
  puts(" )");
  Vec_PtrFree(vCone);
  Vec_PtrFree(vSupp);
  return;
}

Assistant:

void Abc_NodeMffcConeSuppPrint( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vCone, * vSupp;
    Abc_Obj_t * pObj;
    int i;
    vCone = Vec_PtrAlloc( 100 );
    vSupp = Vec_PtrAlloc( 100 );
    Abc_NodeDeref_rec( pNode );
    Abc_NodeMffcConeSupp( pNode, vCone, vSupp );
    Abc_NodeRef_rec( pNode );
    printf( "Node = %6s : Supp = %3d  Cone = %3d  (", 
        Abc_ObjName(pNode), Vec_PtrSize(vSupp), Vec_PtrSize(vCone) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, i )
        printf( " %s", Abc_ObjName(pObj) );
    printf( " )\n" );
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSupp );
}